

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::SrcDir_abi_cxx11_(void)

{
  string *in_RDI;
  char *in_R8;
  char in_R9B;
  initializer_list<const_char_*> environment_variables;
  undefined1 local_a0 [8];
  FilePath argv_0;
  long local_70;
  long *local_60 [2];
  long local_50 [2];
  char *local_40;
  FilePath local_38;
  
  local_40 = "TEST_SRCDIR";
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_38,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&internal::g_argvs_abi_cxx11_);
  argv_0.pathname_.field_2._8_8_ = &stack0xffffffffffffff90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&argv_0.pathname_.field_2 + 8),
             *(long *)local_38.pathname_._M_dataplus._M_p,
             *(long *)(local_38.pathname_._M_dataplus._M_p + 8) +
             *(long *)local_38.pathname_._M_dataplus._M_p);
  internal::FilePath::FilePath((FilePath *)local_a0,(string *)((long)&argv_0.pathname_.field_2 + 8))
  ;
  if ((long *)argv_0.pathname_.field_2._8_8_ != &stack0xffffffffffffff90) {
    operator_delete((void *)argv_0.pathname_.field_2._8_8_,local_70 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_38);
  internal::FilePath::RemoveFileName(&local_38,(FilePath *)local_a0);
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,local_38.pathname_._M_dataplus._M_p,
             local_38.pathname_._M_dataplus._M_p + local_38.pathname_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.pathname_._M_dataplus._M_p != &local_38.pathname_.field_2) {
    operator_delete(local_38.pathname_._M_dataplus._M_p,
                    local_38.pathname_.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != (undefined1  [8])&argv_0.pathname_._M_string_length) {
    operator_delete((void *)local_a0,argv_0.pathname_._M_string_length + 1);
  }
  environment_variables._M_len = (size_type)local_60[0];
  environment_variables._M_array = (iterator)0x1;
  GetDirFromEnv_abi_cxx11_(in_RDI,(testing *)&local_40,environment_variables,in_R8,in_R9B);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string SrcDir() {
#if defined(GTEST_CUSTOM_SRCDIR_FUNCTION_)
  return GTEST_CUSTOM_SRCDIR_FUNCTION_();
#elif defined(GTEST_OS_WINDOWS) || defined(GTEST_OS_WINDOWS_MOBILE)
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '\\');
#elif defined(GTEST_OS_LINUX_ANDROID)
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '/');
#else
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '/');
#endif
}